

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O2

int ON_Intersect(ON_Line *line,ON_Cylinder *cylinder,ON_3dPoint *A,ON_3dPoint *B)

{
  ON_3dVector *v;
  ON_3dPoint *point;
  ON_3dPoint point_00;
  ON_3dPoint point_01;
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_3dVector V;
  double axis_t;
  double local_1f8;
  ulong uStack_1f0;
  double local_1e0;
  ON_Line L;
  double t1;
  double line_t;
  ON_3dPoint axis_point;
  ON_Line axis;
  ON_3dVector local_138;
  double t0;
  ON_Xform xform;
  ON_3dVector local_90;
  ON_3dPoint line_point;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  local_1f8 = (cylinder->circle).radius;
  uStack_1f0 = 0;
  ON_Line::ON_Line(&axis);
  v = &(cylinder->circle).plane.zaxis;
  operator*((ON_3dVector *)&L,cylinder->height[0],v);
  ON_3dPoint::operator+((ON_3dPoint *)&xform,(ON_3dPoint *)cylinder,(ON_3dVector *)&L);
  axis.from.z = xform.m_xform[0][2];
  axis.from.x = xform.m_xform[0][0];
  axis.from.y = xform.m_xform[0][1];
  operator*((ON_3dVector *)&L,cylinder->height[1],v);
  ON_3dPoint::operator+((ON_3dPoint *)&xform,(ON_3dPoint *)cylinder,(ON_3dVector *)&L);
  axis.to.z = xform.m_xform[0][2];
  axis.to.x = xform.m_xform[0][0];
  axis.to.y = xform.m_xform[0][1];
  local_1e0 = ON_Line::Length(&axis);
  local_1f8 = ABS(local_1f8);
  uStack_1f0 = uStack_1f0 & 0x7fffffffffffffff;
  dVar5 = 2.3283064365386963e-10;
  if (2.3283064365386963e-10 <= local_1f8 * 1.490116119385e-08) {
    dVar5 = local_1f8 * 1.490116119385e-08;
  }
  if (local_1e0 <= dVar5) {
    ON_3dPoint::operator+((ON_3dPoint *)&xform,(ON_3dPoint *)cylinder,v);
    axis.to.z = xform.m_xform[0][2];
    axis.to.x = xform.m_xform[0][0];
    axis.to.y = xform.m_xform[0][1];
  }
  bVar1 = ON_Intersect(line,&axis,&line_t,&axis_t);
  if (!bVar1) {
    ON_Line::ClosestPointTo(&axis,(ON_3dPoint *)cylinder,&axis_t);
    ON_Line::ClosestPointTo(line,(ON_3dPoint *)cylinder,&line_t);
  }
  ON_Line::PointAt(&line_point,line,line_t);
  ON_Line::PointAt(&axis_point,&axis,axis_t);
  dVar6 = ON_3dPoint::DistanceTo(&line_point,&axis_point);
  if (dVar5 < local_1e0) {
    uVar3 = SUB84(axis_t,0);
    uVar4 = (undefined4)((ulong)axis_t >> 0x20);
    if (0.0 <= axis_t) {
      if (1.0 < axis_t) {
        axis_t = 1.0;
        uVar3 = 0;
        uVar4 = 0x3ff00000;
      }
    }
    else {
      axis_t = 0.0;
      uVar3 = 0;
      uVar4 = 0;
    }
    ON_Line::PointAt((ON_3dPoint *)&xform,&axis,(double)CONCAT44(uVar4,uVar3));
    axis_point.z = xform.m_xform[0][2];
    axis_point.x = xform.m_xform[0][0];
    axis_point.y = xform.m_xform[0][1];
  }
  if (local_1f8 - dVar5 <= dVar6) {
    A->z = line_point.z;
    A->x = line_point.x;
    A->y = line_point.y;
    ON_3dPoint::operator-((ON_3dVector *)&xform,&line_point,&axis_point);
    if (dVar5 < local_1e0) {
      dVar7 = ON_3dVector::operator*((ON_3dVector *)&xform,v);
      operator*(&V,dVar7,v);
      ON_3dVector::operator-((ON_3dVector *)&L,(ON_3dVector *)&xform,&V);
      xform.m_xform[0][2] = L.from.z;
      xform.m_xform[0][0] = L.from.x;
      xform.m_xform[0][1] = L.from.y;
    }
    ON_3dVector::Unitize((ON_3dVector *)&xform);
    operator*(&V,local_1f8,(ON_3dVector *)&xform);
    ON_3dPoint::operator+(&L.from,&axis_point,&V);
    iVar2 = 0;
    B->z = L.from.z;
    B->x = L.from.x;
    B->y = L.from.y;
    if (dVar6 <= local_1f8 + dVar5) {
      ON_Line::ClosestPointTo(&L.from,&axis,&line->from);
      dVar6 = ON_3dPoint::DistanceTo(&L.from,&line->from);
      iVar2 = 1;
      if (ABS(dVar6 - local_1f8) <= dVar5) {
        point = &line->to;
        ON_Line::ClosestPointTo((ON_3dPoint *)&V,&axis,point);
        L.from.z = V.z;
        L.from.x = V.x;
        L.from.y = V.y;
        dVar6 = ON_3dPoint::DistanceTo(&L.from,point);
        if (ABS(dVar6 - local_1f8) <= dVar5) {
          ON_Cylinder::ClosestPointTo((ON_3dPoint *)&V,cylinder,line->from);
          A->z = V.z;
          A->x = V.x;
          A->y = V.y;
          ON_Cylinder::ClosestPointTo((ON_3dPoint *)&V,cylinder,*point);
          B->z = V.z;
          B->x = V.x;
          B->y = V.y;
          iVar2 = 3;
        }
      }
    }
  }
  else {
    ON_Xform::ON_Xform(&xform);
    ON_Xform::Rotation(&xform,(ON_Plane *)cylinder,&ON_xy_plane);
    L.from.x = (line->from).x;
    L.from.y = (line->from).y;
    L.from.z = (line->from).z;
    L.to.x = (line->to).x;
    L.to.y = (line->to).y;
    L.to.z = (line->to).z;
    ON_Line::Transform(&L,&xform);
    dVar7 = L.to.x - L.from.x;
    dVar6 = L.to.y - L.from.y;
    iVar2 = ON_SolveQuadraticEquation
                      (dVar6 * dVar6 + dVar7 * dVar7,
                       (dVar6 + dVar6) * L.from.y + (dVar7 + dVar7) * L.from.x,
                       (L.from.y * L.from.y + L.from.x * L.from.x) - local_1f8 * local_1f8,&t0,&t1);
    if (iVar2 == 2) {
      t1 = t0;
    }
    ON_Line::PointAt(&local_48,line,t0);
    point_00.y = local_48.y;
    point_00.x = local_48.x;
    point_00.z = local_48.z;
    ON_Cylinder::ClosestPointTo((ON_3dPoint *)&V,cylinder,point_00);
    A->z = V.z;
    A->x = V.x;
    A->y = V.y;
    ON_Line::PointAt(&local_60,line,t1);
    point_01.y = local_60.y;
    point_01.x = local_60.x;
    point_01.z = local_60.z;
    ON_Cylinder::ClosestPointTo((ON_3dPoint *)&V,cylinder,point_01);
    B->z = V.z;
    B->x = V.x;
    B->y = V.y;
    dVar6 = ON_3dPoint::DistanceTo(A,B);
    if (dVar6 <= 2.3283064365386963e-10) {
      A->z = line_point.z;
      A->x = line_point.x;
      A->y = line_point.y;
      ON_3dPoint::operator-(&V,&line_point,&axis_point);
      if (dVar5 < local_1e0) {
        dVar5 = ON_3dVector::operator*(&V,v);
        operator*(&local_90,dVar5,v);
        ON_3dVector::operator-(&local_138,&V,&local_90);
        V.z = local_138.z;
        V.x = local_138.x;
        V.y = local_138.y;
      }
      ON_3dVector::Unitize(&V);
      operator*(&local_90,local_1f8,&V);
      ON_3dPoint::operator+((ON_3dPoint *)&local_138,&axis_point,&local_90);
      B->z = local_138.z;
      B->x = local_138.x;
      B->y = local_138.y;
      iVar2 = 1;
    }
    else {
      iVar2 = 2;
    }
    ON_Line::~ON_Line(&L);
  }
  ON_Line::~ON_Line(&axis);
  return iVar2;
}

Assistant:

int ON_Intersect(
        const ON_Line& line, 
        const ON_Cylinder& cylinder, // if cylinder.height[0]==cylinder.height[1],
                                     // then infinite cyl is used.  Otherwise
                                     // finite cyl is used.
        ON_3dPoint& A, ON_3dPoint& B // intersection point(s) returned here
        )
{
  bool bFiniteCyl = true;
  int rc = 0;
  const double cylinder_radius = fabs(cylinder.circle.radius);
  double tol = cylinder_radius*ON_SQRT_EPSILON;
  if ( tol < ON_ZERO_TOLERANCE )
    tol = ON_ZERO_TOLERANCE;

  ON_Line axis;
  axis.from = cylinder.circle.plane.origin + cylinder.height[0]*cylinder.circle.plane.zaxis;
  axis.to   = cylinder.circle.plane.origin + cylinder.height[1]*cylinder.circle.plane.zaxis;
  if ( axis.Length() <= tol ) {
    axis.to = cylinder.circle.plane.origin + cylinder.circle.plane.zaxis;
    bFiniteCyl = false;
  }


  //bool bIsParallel = false;
  double line_t, axis_t;
  if ( !ON_Intersect(line,axis,&line_t,&axis_t) ) {
    axis.ClosestPointTo( cylinder.circle.plane.origin, &axis_t );
    line.ClosestPointTo( cylinder.circle.plane.origin, &line_t );
  }
  ON_3dPoint line_point = line.PointAt(line_t);
  ON_3dPoint axis_point = axis.PointAt(axis_t);
  double d = line_point.DistanceTo(axis_point);
  if ( bFiniteCyl ) {
    if ( axis_t < 0.0 )
      axis_t = 0.0;
    else if ( axis_t > 1.0 )
      axis_t = 1.0;
    axis_point = axis.PointAt(axis_t);
  }
  
  if ( d >= cylinder_radius-tol) {
    rc = ( d <= cylinder_radius+tol ) ? 1 : 0;
    A = line_point;
    ON_3dVector V = line_point - axis_point;
    if ( bFiniteCyl ) {
      V = V - (V*cylinder.circle.plane.zaxis)*cylinder.circle.plane.zaxis;
    }
    V.Unitize();
    B = axis_point + cylinder_radius*V;
    if ( rc == 1 ) {
      // check for overlap
      ON_3dPoint P = axis.ClosestPointTo(line.from);
      d = P.DistanceTo(line.from);
      if ( fabs(d-cylinder_radius) <= tol ) {
        P = axis.ClosestPointTo(line.to);
        d = P.DistanceTo(line.to);
        if ( fabs(d-cylinder_radius) <= tol ) {
          rc = 3;
          A = cylinder.ClosestPointTo(line.from);
          B = cylinder.ClosestPointTo(line.to);
        }
      }
    }
  }
  else {
    // transform to coordinate system where equation of cyl
    // is x^2 + y^2 = R^2 and solve for line parameter(s).
    ON_Xform xform;
    xform.Rotation( cylinder.circle.plane, ON_xy_plane );
    ON_Line L = line;
    L.Transform(xform);

    const double x0 = L.from.x;
    const double x1 = L.to.x;
    const double x1mx0 = x1-x0;
    double ax = x1mx0*x1mx0;
    double bx = 2.0*x1mx0*x0;
    double cx = x0*x0;

    const double y0 = L.from.y;
    const double y1 = L.to.y;
    const double y1my0 = y1-y0;
    double ay = y1my0*y1my0;
    double by = 2.0*y1my0*y0;
    double cy = y0*y0;

    double t0, t1;
    int qerc = ON_SolveQuadraticEquation(ax+ay, bx+by, cx+cy-cylinder_radius*cylinder_radius,
                                         &t0,&t1);
    if ( qerc == 2 ) {
      // complex roots - ignore (tiny) imaginary part caused by computational noise.
      t1 = t0;
    }
    A = cylinder.ClosestPointTo(line.PointAt(t0));
    B = cylinder.ClosestPointTo(line.PointAt(t1));

    d = A.DistanceTo(B);
    if ( d <= ON_ZERO_TOLERANCE ) {
      A = line_point;
      ON_3dVector V = line_point - axis_point;
      if ( bFiniteCyl ) {
        V = V - (V*cylinder.circle.plane.zaxis)*cylinder.circle.plane.zaxis;
      }
      V.Unitize();
      B = axis_point + cylinder_radius*V;
      rc = 1;
    }    
    else
      rc = 2;
  }
  return rc;
}